

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImGuiViewportP *viewport,ImDrawList *draw_list,char *label)

{
  ImDrawListFlags IVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ImDrawList *pIVar6;
  ImDrawCmd *pIVar7;
  ImDrawVert *pIVar8;
  void **lhs;
  float fVar9;
  char *local_328;
  uint local_304;
  ImVec2 *local_2e8;
  uint local_2cc;
  ImVec2 *local_2b0;
  long local_2a0;
  ImDrawList *local_280;
  char *local_270;
  ImDrawListFlags backup_flags;
  ImDrawVert *local_248;
  ImDrawVert *v;
  int n_1;
  ImVec2 triangle_1 [3];
  char *buf_end;
  char *buf_p;
  int local_200;
  int idx_i;
  int prim;
  undefined1 local_1ec [8];
  ImGuiListClipper clipper;
  int local_1cc;
  int n;
  ImVec2 triangle [3];
  uint local_1a4;
  float local_1a0;
  uint base_idx;
  float total_area;
  bool pcmd_node_open;
  char buf [300];
  ImDrawIdx *idx_buffer;
  ImDrawCmd *pcmd;
  ImVec2 IStack_50;
  uint elem_offset;
  ImDrawList *local_48;
  ImDrawList *fg_draw_list;
  byte local_29;
  char *pcStack_28;
  bool node_open;
  char *label_local;
  ImDrawList *draw_list_local;
  ImGuiViewportP *viewport_local;
  ImGuiWindow *window_local;
  
  if (draw_list->_OwnerName == (char *)0x0) {
    local_270 = "";
  }
  else {
    local_270 = draw_list->_OwnerName;
  }
  pcStack_28 = label;
  label_local = (char *)draw_list;
  draw_list_local = (ImDrawList *)viewport;
  viewport_local = (ImGuiViewportP *)window;
  local_29 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,local_270,
                      (ulong)(uint)(draw_list->VtxBuffer).Size,
                      (ulong)(uint)(draw_list->IdxBuffer).Size,(draw_list->CmdBuffer).Size);
  pcVar2 = label_local;
  pIVar6 = GetWindowDrawList();
  if ((ImDrawList *)pcVar2 == pIVar6) {
    SameLine(0.0,-1.0);
    ImVec4::ImVec4((ImVec4 *)((long)&fg_draw_list + 4),1.0,0.4,0.4,1.0);
    TextColored((ImVec4 *)((long)&fg_draw_list + 4),"CURRENTLY APPENDING");
    if ((local_29 & 1) != 0) {
      TreePop();
    }
  }
  else {
    if (draw_list_local == (ImDrawList *)0x0) {
      local_280 = (ImDrawList *)0x0;
    }
    else {
      local_280 = GetForegroundDrawList((ImGuiViewport *)draw_list_local);
    }
    local_48 = local_280;
    if (((viewport_local != (ImGuiViewportP *)0x0) && (local_280 != (ImDrawList *)0x0)) &&
       (bVar3 = IsItemHovered(0), pIVar6 = local_48, bVar3)) {
      lhs = &(viewport_local->super_ImGuiViewport).PlatformUserData;
      IStack_50 = operator+((ImVec2 *)lhs,
                            (ImVec2 *)&(viewport_local->super_ImGuiViewport).PlatformHandle);
      ImDrawList::AddRect(pIVar6,(ImVec2 *)lhs,&stack0xffffffffffffffb0,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_29 & 1) != 0) {
      if ((viewport_local != (ImGuiViewportP *)0x0) &&
         (((viewport_local->DrawDataP).TotalVtxCount & 1) == 0)) {
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
      }
      pcmd._4_4_ = 0;
      for (idx_buffer = (ImDrawIdx *)ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
          pIVar7 = ImVector<ImDrawCmd>::end((ImVector<ImDrawCmd> *)label_local), idx_buffer < pIVar7
          ; idx_buffer = idx_buffer + 0x1c) {
        if ((*(long *)(idx_buffer + 0x14) != 0) || (*(int *)(idx_buffer + 0x10) != 0)) {
          if (*(long *)(idx_buffer + 0x14) == 0) {
            if (*(int *)(label_local + 0x10) < 1) {
              local_2a0 = 0;
            }
            else {
              local_2a0 = *(long *)(label_local + 0x18);
            }
            stack0xffffffffffffff98 = local_2a0;
            ImFormatString((char *)&total_area,300,
                           "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                           (double)*(float *)idx_buffer,(double)*(float *)(idx_buffer + 2),
                           (double)*(float *)(idx_buffer + 4),(double)*(float *)(idx_buffer + 6),
                           (ulong)*(uint *)(idx_buffer + 0x10) / 3,*(undefined8 *)(idx_buffer + 8));
            pIVar7 = ImVector<ImDrawCmd>::begin((ImVector<ImDrawCmd> *)label_local);
            bVar3 = TreeNode((void *)(((long)idx_buffer - (long)pIVar7) / 0x38),"%s",&total_area);
            bVar4 = IsItemHovered(0);
            if ((bVar4) &&
               ((((show_drawcmd_mesh & 1U) != 0 || ((show_drawcmd_aabb & 1U) != 0)) &&
                (local_48 != (ImDrawList *)0x0)))) {
              NodeDrawCmdShowMeshAndBoundingBox
                        (local_48,(ImDrawList *)label_local,(ImDrawCmd *)idx_buffer,pcmd._4_4_,
                         (bool)(show_drawcmd_mesh & 1),(bool)(show_drawcmd_aabb & 1));
            }
            if (bVar3) {
              local_1a0 = 0.0;
              for (local_1a4 = pcmd._4_4_; local_1a4 < pcmd._4_4_ + *(int *)(idx_buffer + 0x10);
                  local_1a4 = local_1a4 + 3) {
                local_2b0 = (ImVec2 *)&stack0xfffffffffffffe38;
                do {
                  ImVec2::ImVec2(local_2b0);
                  local_2b0 = local_2b0 + 1;
                } while (local_2b0 != triangle + 2);
                for (local_1cc = 0; local_1cc < 3; local_1cc = local_1cc + 1) {
                  if (stack0xffffffffffffff98 == 0) {
                    local_2cc = local_1a4 + local_1cc;
                  }
                  else {
                    local_2cc = (uint)*(ushort *)
                                       (stack0xffffffffffffff98 + (ulong)(local_1a4 + local_1cc) * 2
                                       );
                  }
                  pIVar8 = ImVector<ImDrawVert>::operator[]
                                     ((ImVector<ImDrawVert> *)(label_local + 0x20),local_2cc);
                  *(ImVec2 *)(&stack0xfffffffffffffe38 + (long)local_1cc * 8) = pIVar8->pos;
                }
                fVar9 = ImTriangleArea((ImVec2 *)&stack0xfffffffffffffe38,triangle,triangle + 1);
                local_1a0 = fVar9 + local_1a0;
              }
              ImFormatString((char *)&total_area,300,
                             "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                             (double)local_1a0,(ulong)*(uint *)(idx_buffer + 0x10),
                             (ulong)*(uint *)(idx_buffer + 0xc));
              ImVec2::ImVec2((ImVec2 *)&clipper.ItemsHeight,0.0,0.0);
              Selectable((char *)&total_area,false,0,(ImVec2 *)&clipper.ItemsHeight);
              bVar3 = IsItemHovered(0);
              if ((bVar3) && (local_48 != (ImDrawList *)0x0)) {
                NodeDrawCmdShowMeshAndBoundingBox
                          (local_48,(ImDrawList *)label_local,(ImDrawCmd *)idx_buffer,pcmd._4_4_,
                           true,false);
              }
              ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_1ec);
              ImGuiListClipper::Begin
                        ((ImGuiListClipper *)local_1ec,*(uint *)(idx_buffer + 0x10) / 3,-1.0);
              while (bVar3 = ImGuiListClipper::Step((ImGuiListClipper *)local_1ec), bVar3) {
                buf_p._4_4_ = pcmd._4_4_ + local_1ec._0_4_ * 3;
                for (local_200 = local_1ec._0_4_; local_200 < (int)local_1ec._4_4_;
                    local_200 = local_200 + 1) {
                  buf_end = (char *)&total_area;
                  local_2e8 = (ImVec2 *)&stack0xfffffffffffffdc8;
                  do {
                    ImVec2::ImVec2(local_2e8);
                    local_2e8 = local_2e8 + 1;
                  } while (local_2e8 != triangle_1 + 2);
                  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
                    if (stack0xffffffffffffff98 == 0) {
                      local_304 = buf_p._4_4_;
                    }
                    else {
                      local_304 = (uint)*(ushort *)
                                         (stack0xffffffffffffff98 + (long)(int)buf_p._4_4_ * 2);
                    }
                    local_248 = ImVector<ImDrawVert>::operator[]
                                          ((ImVector<ImDrawVert> *)(label_local + 0x20),local_304);
                    *(ImVec2 *)(&stack0xfffffffffffffdc8 + (long)v._4_4_ * 8) = local_248->pos;
                    if (v._4_4_ == 0) {
                      local_328 = "Vert:";
                    }
                    else {
                      local_328 = "     ";
                    }
                    iVar5 = ImFormatString(buf_end,(size_t)(buf + (0x124 - (long)buf_end)),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           (double)(local_248->pos).x,(double)(local_248->pos).y,
                                           (double)(local_248->uv).x,(double)(local_248->uv).y,
                                           local_328,(ulong)buf_p._4_4_,(ulong)local_248->col);
                    buf_end = buf_end + iVar5;
                    buf_p._4_4_ = buf_p._4_4_ + 1;
                  }
                  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffdb0,0.0,0.0);
                  Selectable((char *)&total_area,false,0,(ImVec2 *)&stack0xfffffffffffffdb0);
                  if ((local_48 != (ImDrawList *)0x0) && (bVar3 = IsItemHovered(0), bVar3)) {
                    IVar1 = local_48->Flags;
                    local_48->Flags = local_48->Flags & 0xfffffffe;
                    ImDrawList::AddPolyline
                              (local_48,(ImVec2 *)&stack0xfffffffffffffdc8,3,0xff00ffff,true,1.0);
                    local_48->Flags = IVar1;
                  }
                }
              }
              TreePop();
              ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_1ec);
            }
          }
          else {
            BulletText("Callback %p, user_data %p",*(undefined8 *)(idx_buffer + 0x14),
                       *(undefined8 *)(idx_buffer + 0x18));
          }
        }
        pcmd._4_4_ = *(int *)(idx_buffer + 0x10) + pcmd._4_4_;
      }
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImGuiViewportP* viewport, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* fg_draw_list = viewport ? GetForegroundDrawList(viewport) : NULL; // Render additional visuals into the top-most draw list
            if (window && fg_draw_list && ImGui::IsItemHovered())
                fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            if (window && !window->WasActive)
                ImGui::TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

            unsigned int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }

                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                char buf[300];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d triangles, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                    pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
                    pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
                if (ImGui::IsItemHovered() && (show_drawcmd_mesh || show_drawcmd_aabb) && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, show_drawcmd_mesh, show_drawcmd_aabb);
                if (!pcmd_node_open)
                    continue;

                // Calculate approximate coverage area (touched pixel count)
                // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
                float total_area = 0.0f;
                for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + pcmd->ElemCount); base_idx += 3)
                {
                    ImVec2 triangle[3];
                    for (int n = 0; n < 3; n++)
                        triangle[n] = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
                }

                // Display vertex information summary. Hover to get all triangles drawn in wire-frame
                ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
                ImGui::Selectable(buf);
                if (ImGui::IsItemHovered() && fg_draw_list)
                    NodeDrawCmdShowMeshAndBoundingBox(fg_draw_list, draw_list, pcmd, elem_offset, true, false);

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper;
                clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, idx_i = elem_offset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
                    {
                        char* buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangle[3];
                        for (int n = 0; n < 3; n++, idx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                            triangle[n] = v.pos;
                            buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }

                        ImGui::Selectable(buf, false);
                        if (fg_draw_list && ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = fg_draw_list->Flags;
                            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                            fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            fg_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }